

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

void __thiscall re2::Regexp::Walker<re2::Regexp_*>::Reset(Walker<re2::Regexp_*> *this)

{
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  *psVar1;
  size_type sVar2;
  _Elt_pointer pWVar3;
  LogMessage local_190;
  
  if (this->stack_ !=
      (stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
       *)0x0) {
    sVar2 = std::
            deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>::
            size(&this->stack_->c);
    if (sVar2 != 0) {
      LogMessage::LogMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/walker-inl.h"
                 ,0x97);
      std::operator<<((ostream *)&local_190.str_,"Stack not empty.");
      LogMessage::~LogMessage(&local_190);
      while( true ) {
        sVar2 = std::
                deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                ::size(&this->stack_->c);
        if (sVar2 == 0) break;
        psVar1 = this->stack_;
        pWVar3 = (psVar1->c).
                 super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pWVar3 == (psVar1->c).
                      super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pWVar3 = (psVar1->c).
                   super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        operator_delete(pWVar3[-1].child_args);
        std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>::
        pop_back(&this->stack_->c);
      }
    }
  }
  return;
}

Assistant:

void Regexp::Walker<T>::Reset() {
  if (stack_ && stack_->size() > 0) {
    LOG(DFATAL) << "Stack not empty.";
    while (stack_->size() > 0) {
      delete stack_->top().child_args;
      stack_->pop();
    }
  }
}